

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

int serverAtomicRead(void *fd,void *buffer,int length)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  uint in_EDX;
  void *in_RSI;
  void *in_RDI;
  double dVar4;
  int ret;
  int junk_errno;
  char *junk_result_str;
  uint local_24;
  char *local_20;
  uint local_14;
  
  local_20 = (char *)0x0;
  local_14 = in_EDX;
  uVar1 = (*ffs_server_read_func)(in_RDI,in_RSI,(long)(int)in_EDX,(int *)&local_24,&local_20);
  pcVar3 = getenv("BAD_CLIENT");
  if ((pcVar3 != (char *)0x0) && (dVar4 = drand48(), dVar4 < 0.0001)) {
    sleep(600);
  }
  if (((uVar1 != local_14) && (iVar2 = get_format_server_verbose(), iVar2 != 0)) &&
     (printf("server read error, return is %d, length %d, errno %d\n",(ulong)uVar1,(ulong)local_14,
             (ulong)local_24), local_20 != (char *)0x0)) {
    printf("result_string is %s\n",local_20);
  }
  return uVar1;
}

Assistant:

extern int
serverAtomicRead(void *fd, void *buffer, int length)
{
    char *junk_result_str = NULL;
    int junk_errno;
    int ret = ffs_server_read_func(fd, buffer, length, &junk_errno,
				  &junk_result_str);

    if (getenv("BAD_CLIENT") && (drand48() < 0.0001)) sleep(600);
    if (ret != length) {
	if (get_format_server_verbose()) {
	    printf("server read error, return is %d, length %d, errno %d\n",
		   ret, length, junk_errno);
	    if (junk_result_str != NULL) {
		printf("result_string is %s\n", junk_result_str);
	    }
	}
    }
    return ret;
}